

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

CharIterator * __thiscall
absl::Cord::Find(CharIterator *__return_storage_ptr__,Cord *this,Cord *needle)

{
  CharIterator it;
  CharIterator haystack;
  CharIterator haystack_00;
  CharIterator needle_end;
  CharIterator needle_end_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  ChunkIterator *pCVar7;
  undefined8 *puVar8;
  size_t *psVar9;
  byte bVar10;
  reference needle_00;
  undefined1 in_stack_fffffffffffff9c8 [88];
  undefined1 in_stack_fffffffffffffa20 [64];
  undefined1 in_stack_fffffffffffffa60 [88];
  ChunkIterator in_stack_fffffffffffffab8;
  undefined1 auStack_4b0 [64];
  size_t local_468;
  char *local_460;
  CharIterator haystack_it;
  ChunkIterator local_3c0;
  undefined8 local_328 [5];
  undefined4 local_300;
  CharIterator needle_it;
  CharIterator haystack_advanced_it;
  undefined8 local_160 [5];
  undefined4 local_138;
  ChunkIterator local_c8;
  
  bVar10 = 0;
  bVar1 = empty(needle);
  if (bVar1) {
LAB_0012a29a:
    ChunkIterator::ChunkIterator(&__return_storage_ptr__->chunk_iterator_,this);
  }
  else {
    sVar2 = InlineRep::size(&needle->contents_);
    sVar3 = InlineRep::size(&this->contents_);
    if (sVar2 <= sVar3) {
      sVar3 = InlineRep::size(&this->contents_);
      if (sVar2 == sVar3) {
        bVar1 = operator==(this,needle);
        if (bVar1) goto LAB_0012a29a;
      }
      else {
        ChunkIterator::ChunkIterator(&local_3c0,needle);
        needle_00 = ChunkIterator::operator*(&local_3c0);
        local_468 = needle_00._M_len;
        local_460 = needle_00._M_str;
        ChunkIterator::ChunkIterator(&haystack_it.chunk_iterator_,this);
        do {
          pCVar7 = &haystack_it.chunk_iterator_;
          psVar9 = (size_t *)&stack0xfffffffffffff9c8;
          for (lVar4 = 0x13; lVar4 != 0; lVar4 = lVar4 + -1) {
            *psVar9 = (pCVar7->current_chunk_)._M_len;
            pCVar7 = (ChunkIterator *)((long)pCVar7 + (ulong)bVar10 * -0x10 + 8);
            psVar9 = psVar9 + (ulong)bVar10 * -2 + 1;
          }
          it.chunk_iterator_.btree_reader_.navigator_.node_[4] =
               (CordRepBtree *)in_stack_fffffffffffffa20._0_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[5] =
               (CordRepBtree *)in_stack_fffffffffffffa20._8_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[6] =
               (CordRepBtree *)in_stack_fffffffffffffa20._16_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[7] =
               (CordRepBtree *)in_stack_fffffffffffffa20._24_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[8] =
               (CordRepBtree *)in_stack_fffffffffffffa20._32_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[9] =
               (CordRepBtree *)in_stack_fffffffffffffa20._40_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[10] =
               (CordRepBtree *)in_stack_fffffffffffffa20._48_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[0xb] =
               (CordRepBtree *)in_stack_fffffffffffffa20._56_8_;
          it.chunk_iterator_.current_chunk_._M_len = SUB168(in_stack_fffffffffffff9c8._0_16_,0);
          it.chunk_iterator_.current_chunk_._M_str =
               (char *)SUB168(in_stack_fffffffffffff9c8._0_16_,8);
          it.chunk_iterator_.current_leaf_ =
               (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffff9c8._16_8_;
          it.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffff9c8._24_8_;
          it.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffff9c8._32_8_;
          it.chunk_iterator_.btree_reader_.navigator_.height_ = in_stack_fffffffffffff9c8._40_4_;
          it.chunk_iterator_.btree_reader_.navigator_.index_[0] = in_stack_fffffffffffff9c8[0x2c];
          it.chunk_iterator_.btree_reader_.navigator_.index_[1] = in_stack_fffffffffffff9c8[0x2d];
          it.chunk_iterator_.btree_reader_.navigator_.index_[2] = in_stack_fffffffffffff9c8[0x2e];
          it.chunk_iterator_.btree_reader_.navigator_.index_[3] = in_stack_fffffffffffff9c8[0x2f];
          it.chunk_iterator_.btree_reader_.navigator_.index_[4] = in_stack_fffffffffffff9c8[0x30];
          it.chunk_iterator_.btree_reader_.navigator_.index_[5] = in_stack_fffffffffffff9c8[0x31];
          it.chunk_iterator_.btree_reader_.navigator_.index_[6] = in_stack_fffffffffffff9c8[0x32];
          it.chunk_iterator_.btree_reader_.navigator_.index_[7] = in_stack_fffffffffffff9c8[0x33];
          it.chunk_iterator_.btree_reader_.navigator_.index_[8] = in_stack_fffffffffffff9c8[0x34];
          it.chunk_iterator_.btree_reader_.navigator_.index_[9] = in_stack_fffffffffffff9c8[0x35];
          it.chunk_iterator_.btree_reader_.navigator_.index_[10] = in_stack_fffffffffffff9c8[0x36];
          it.chunk_iterator_.btree_reader_.navigator_.index_[0xb] = in_stack_fffffffffffff9c8[0x37];
          it.chunk_iterator_.btree_reader_.navigator_.node_[0] =
               (CordRepBtree *)in_stack_fffffffffffff9c8._56_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[1] =
               (CordRepBtree *)in_stack_fffffffffffff9c8._64_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[2] =
               (CordRepBtree *)in_stack_fffffffffffff9c8._72_8_;
          it.chunk_iterator_.btree_reader_.navigator_.node_[3] =
               (CordRepBtree *)in_stack_fffffffffffff9c8._80_8_;
          FindImpl((CharIterator *)&local_3c0,(Cord *)pCVar7,it,needle_00);
          memcpy(&haystack_it.chunk_iterator_,&local_3c0,0x98);
          if ((haystack_it.chunk_iterator_.bytes_remaining_ == 0) ||
             (haystack_it.chunk_iterator_.bytes_remaining_ < sVar2)) goto LAB_0012a50a;
          memcpy(&haystack_advanced_it.chunk_iterator_,&haystack_it.chunk_iterator_,0x98);
          ChunkIterator::ChunkIterator(&needle_it.chunk_iterator_,needle);
          ChunkIterator::AdvanceBytes(&haystack_advanced_it.chunk_iterator_,local_468);
          ChunkIterator::AdvanceBytes(&needle_it.chunk_iterator_,local_468);
          memset(local_328,0,0x98);
          local_300 = 0xffffffff;
          lVar4 = 0x13;
          pCVar7 = &haystack_advanced_it.chunk_iterator_;
          psVar9 = (size_t *)&stack0xfffffffffffff9c8;
          for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
            *psVar9 = (pCVar7->current_chunk_)._M_len;
            pCVar7 = (ChunkIterator *)((long)pCVar7 + (ulong)bVar10 * -0x10 + 8);
            psVar9 = psVar9 + (ulong)bVar10 * -2 + 1;
          }
          puVar6 = local_328;
          puVar8 = (undefined8 *)&stack0xfffffffffffffaf8;
          for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar8 = *puVar6;
            puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
            puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
          }
          pCVar7 = &needle_it.chunk_iterator_;
          psVar9 = (size_t *)&stack0xfffffffffffffa60;
          for (; lVar4 != 0; lVar4 = lVar4 + -1) {
            *psVar9 = (pCVar7->current_chunk_)._M_len;
            pCVar7 = (ChunkIterator *)((long)pCVar7 + (ulong)bVar10 * -0x10 + 8);
            psVar9 = psVar9 + (ulong)bVar10 * -2 + 1;
          }
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[1] =
               (CordRepBtree *)in_stack_fffffffffffffa60._0_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[2] =
               (CordRepBtree *)in_stack_fffffffffffffa60._8_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[3] =
               (CordRepBtree *)in_stack_fffffffffffffa60._16_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[4] =
               (CordRepBtree *)in_stack_fffffffffffffa60._24_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[5] =
               (CordRepBtree *)in_stack_fffffffffffffa60._32_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[6] =
               (CordRepBtree *)in_stack_fffffffffffffa60._40_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[7] =
               (CordRepBtree *)in_stack_fffffffffffffa60._48_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[8] =
               (CordRepBtree *)in_stack_fffffffffffffa60._56_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[9] =
               (CordRepBtree *)in_stack_fffffffffffffa60._64_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[10] =
               (CordRepBtree *)in_stack_fffffffffffffa60._72_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[0xb] =
               (CordRepBtree *)in_stack_fffffffffffffa60._80_8_;
          haystack.chunk_iterator_.current_chunk_._M_len =
               SUB168(in_stack_fffffffffffffa20._0_16_,0);
          haystack.chunk_iterator_.current_chunk_._M_str =
               (char *)SUB168(in_stack_fffffffffffffa20._0_16_,8);
          haystack.chunk_iterator_.current_leaf_ =
               (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffa20._16_8_;
          haystack.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffffa20._24_8_;
          haystack.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffffa20._32_8_;
          haystack.chunk_iterator_.btree_reader_.navigator_.height_ =
               in_stack_fffffffffffffa20._40_4_;
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[0] =
               in_stack_fffffffffffffa20[0x2c];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[1] =
               in_stack_fffffffffffffa20[0x2d];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[2] =
               in_stack_fffffffffffffa20[0x2e];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[3] =
               in_stack_fffffffffffffa20[0x2f];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[4] =
               in_stack_fffffffffffffa20[0x30];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[5] =
               in_stack_fffffffffffffa20[0x31];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[6] =
               in_stack_fffffffffffffa20[0x32];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[7] =
               in_stack_fffffffffffffa20[0x33];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[8] =
               in_stack_fffffffffffffa20[0x34];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[9] =
               in_stack_fffffffffffffa20[0x35];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[10] =
               in_stack_fffffffffffffa20[0x36];
          haystack.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
               in_stack_fffffffffffffa20[0x37];
          haystack.chunk_iterator_.btree_reader_.navigator_.node_[0] =
               (CordRepBtree *)in_stack_fffffffffffffa20._56_8_;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_[1] =
               (CordRepBtree *)__return_storage_ptr__;
          needle_end.chunk_iterator_._0_64_ = auStack_4b0;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_[2] = (CordRepBtree *)local_468;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_[3] = (CordRepBtree *)local_460;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_[4] =
               (CordRepBtree *)haystack_it.chunk_iterator_.current_chunk_._M_len;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_[5] =
               (CordRepBtree *)haystack_it.chunk_iterator_.current_chunk_._M_str;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_[6] =
               (CordRepBtree *)haystack_it.chunk_iterator_.current_leaf_;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_[7] =
               (CordRepBtree *)haystack_it.chunk_iterator_.bytes_remaining_;
          needle_end.chunk_iterator_.btree_reader_.navigator_.node_._64_32_ =
               haystack_it.chunk_iterator_.btree_reader_._0_32_;
          bVar1 = anon_unknown_70::IsSubcordInCordAt
                            (haystack,(CharIterator)in_stack_fffffffffffffab8,needle_end);
          if (bVar1) goto LAB_0012a4de;
          ChunkIterator::AdvanceBytes(&haystack_it.chunk_iterator_,1);
          if (haystack_it.chunk_iterator_.bytes_remaining_ < sVar2) goto LAB_0012a50a;
        } while (haystack_it.chunk_iterator_.bytes_remaining_ != sVar2);
        memcpy(&local_3c0,&haystack_it,0x98);
        ChunkIterator::ChunkIterator(&local_c8,needle);
        memset(local_160,0,0x98);
        local_138 = 0xffffffff;
        lVar4 = 0x13;
        pCVar7 = &local_3c0;
        psVar9 = (size_t *)&stack0xfffffffffffff9c8;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          *psVar9 = (pCVar7->current_chunk_)._M_len;
          pCVar7 = (ChunkIterator *)((long)pCVar7 + ((ulong)bVar10 * -2 + 1) * 8);
          psVar9 = psVar9 + (ulong)bVar10 * -2 + 1;
        }
        puVar6 = local_160;
        puVar8 = (undefined8 *)&stack0xfffffffffffffaf8;
        for (lVar5 = lVar4; lVar5 != 0; lVar5 = lVar5 + -1) {
          *puVar8 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar10 * -2 + 1;
          puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
        }
        pCVar7 = &local_c8;
        psVar9 = (size_t *)&stack0xfffffffffffffa60;
        for (; lVar4 != 0; lVar4 = lVar4 + -1) {
          *psVar9 = (pCVar7->current_chunk_)._M_len;
          pCVar7 = (ChunkIterator *)((long)pCVar7 + (ulong)bVar10 * -0x10 + 8);
          psVar9 = psVar9 + (ulong)bVar10 * -2 + 1;
        }
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[1] =
             (CordRepBtree *)in_stack_fffffffffffffa60._0_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[2] =
             (CordRepBtree *)in_stack_fffffffffffffa60._8_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[3] =
             (CordRepBtree *)in_stack_fffffffffffffa60._16_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[4] =
             (CordRepBtree *)in_stack_fffffffffffffa60._24_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[5] =
             (CordRepBtree *)in_stack_fffffffffffffa60._32_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[6] =
             (CordRepBtree *)in_stack_fffffffffffffa60._40_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[7] =
             (CordRepBtree *)in_stack_fffffffffffffa60._48_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[8] =
             (CordRepBtree *)in_stack_fffffffffffffa60._56_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[9] =
             (CordRepBtree *)in_stack_fffffffffffffa60._64_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[10] =
             (CordRepBtree *)in_stack_fffffffffffffa60._72_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[0xb] =
             (CordRepBtree *)in_stack_fffffffffffffa60._80_8_;
        haystack_00.chunk_iterator_.current_chunk_._M_len =
             SUB168(in_stack_fffffffffffffa20._0_16_,0);
        haystack_00.chunk_iterator_.current_chunk_._M_str =
             (char *)SUB168(in_stack_fffffffffffffa20._0_16_,8);
        haystack_00.chunk_iterator_.current_leaf_ =
             (Nullable<absl::cord_internal::CordRep_*>)in_stack_fffffffffffffa20._16_8_;
        haystack_00.chunk_iterator_.bytes_remaining_ = in_stack_fffffffffffffa20._24_8_;
        haystack_00.chunk_iterator_.btree_reader_.remaining_ = in_stack_fffffffffffffa20._32_8_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.height_ =
             in_stack_fffffffffffffa20._40_4_;
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[0] =
             in_stack_fffffffffffffa20[0x2c];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[1] =
             in_stack_fffffffffffffa20[0x2d];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[2] =
             in_stack_fffffffffffffa20[0x2e];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[3] =
             in_stack_fffffffffffffa20[0x2f];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[4] =
             in_stack_fffffffffffffa20[0x30];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[5] =
             in_stack_fffffffffffffa20[0x31];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[6] =
             in_stack_fffffffffffffa20[0x32];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[7] =
             in_stack_fffffffffffffa20[0x33];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[8] =
             in_stack_fffffffffffffa20[0x34];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[9] =
             in_stack_fffffffffffffa20[0x35];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[10] =
             in_stack_fffffffffffffa20[0x36];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.index_[0xb] =
             in_stack_fffffffffffffa20[0x37];
        haystack_00.chunk_iterator_.btree_reader_.navigator_.node_[0] =
             (CordRepBtree *)in_stack_fffffffffffffa20._56_8_;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[1] =
             (CordRepBtree *)__return_storage_ptr__;
        needle_end_00.chunk_iterator_._0_64_ = auStack_4b0;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[2] = (CordRepBtree *)local_468;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[3] = (CordRepBtree *)local_460;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[4] =
             (CordRepBtree *)haystack_it.chunk_iterator_.current_chunk_._M_len;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[5] =
             (CordRepBtree *)haystack_it.chunk_iterator_.current_chunk_._M_str;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[6] =
             (CordRepBtree *)haystack_it.chunk_iterator_.current_leaf_;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_[7] =
             (CordRepBtree *)haystack_it.chunk_iterator_.bytes_remaining_;
        needle_end_00.chunk_iterator_.btree_reader_.navigator_.node_._64_32_ =
             haystack_it.chunk_iterator_.btree_reader_._0_32_;
        bVar1 = anon_unknown_70::IsSubcordInCordAt
                          (haystack_00,(CharIterator)in_stack_fffffffffffffab8,needle_end_00);
        if (bVar1) {
LAB_0012a4de:
          memcpy(__return_storage_ptr__,&haystack_it,0x98);
          return __return_storage_ptr__;
        }
      }
    }
LAB_0012a50a:
    memset(__return_storage_ptr__,0,0x98);
    (__return_storage_ptr__->chunk_iterator_).btree_reader_.navigator_.height_ = -1;
  }
  return __return_storage_ptr__;
}

Assistant:

absl::Cord::CharIterator absl::Cord::Find(const absl::Cord& needle) const {
  if (needle.empty()) {
    return char_begin();
  }
  const auto needle_size = needle.size();
  if (needle_size > size()) {
    return char_end();
  }
  if (needle_size == size()) {
    return *this == needle ? char_begin() : char_end();
  }
  const auto needle_chunk = Cord::ChunkRemaining(needle.char_begin());
  auto haystack_it = char_begin();
  while (true) {
    haystack_it = FindImpl(haystack_it, needle_chunk);
    if (haystack_it == char_end() ||
        haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    // We found the first chunk of `needle` at `haystack_it` but not the entire
    // subcord. Advance past the first chunk and check for the remainder.
    auto haystack_advanced_it = haystack_it;
    auto needle_it = needle.char_begin();
    Cord::Advance(&haystack_advanced_it, needle_chunk.size());
    Cord::Advance(&needle_it, needle_chunk.size());
    if (IsSubcordInCordAt(haystack_advanced_it, needle_it, needle.char_end())) {
      return haystack_it;
    }
    Cord::Advance(&haystack_it, 1);
    if (haystack_it.chunk_iterator_.bytes_remaining_ < needle_size) {
      break;
    }
    if (haystack_it.chunk_iterator_.bytes_remaining_ == needle_size) {
      // Special case, if there is exactly `needle_size` bytes remaining, the
      // subcord is either at `haystack_it` or not at all.
      if (IsSubcordInCordAt(haystack_it, needle)) {
        return haystack_it;
      }
      break;
    }
  }
  return char_end();
}